

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O0

bool __thiscall QSQLiteDriver::hasFeature(QSQLiteDriver *this,DriverFeature f)

{
  DriverFeature f_local;
  QSQLiteDriver *this_local;
  
  if (f != Transactions) {
    if (f == QuerySize) {
      return false;
    }
    if (2 < f - BLOB) {
      if (f == NamedPlaceholders) {
        return true;
      }
      if (1 < f - PositionalPlaceholders) {
        if (f != BatchOperations) {
          if (f - SimpleLocking < 4) {
            return true;
          }
          if (1 < f - MultipleResultSets) {
            return false;
          }
        }
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool QSQLiteDriver::hasFeature(DriverFeature f) const
{
    switch (f) {
    case BLOB:
    case Transactions:
    case Unicode:
    case LastInsertId:
    case PreparedQueries:
    case PositionalPlaceholders:
    case SimpleLocking:
    case FinishQuery:
    case LowPrecisionNumbers:
    case EventNotifications:
        return true;
    case QuerySize:
    case BatchOperations:
    case MultipleResultSets:
    case CancelQuery:
        return false;
    case NamedPlaceholders:
#if (SQLITE_VERSION_NUMBER < 3003011)
        return false;
#else
        return true;
#endif

    }
    return false;
}